

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandInit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Abc_Ntk_t *pNtk;
  size_t sVar10;
  long lVar11;
  time_t tVar12;
  Vec_Ptr_t *pVVar13;
  Aig_Man_t *pAig;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar14;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  undefined8 uVar19;
  uint local_50;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar5 = false;
  bVar4 = false;
  bVar6 = false;
  local_50 = 0;
  pcVar17 = (char *)0x0;
  do {
    while (iVar7 = Extra_UtilGetopt(argc,argv,"Szordcnh"), iVar7 != 0x53) {
      if (iVar7 < 0x6e) {
        if (iVar7 == -1) {
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar17 = "Empty network.\n";
            iVar7 = -1;
            goto LAB_002167fa;
          }
          uVar8 = pNtk->nObjCounts[8];
          if (uVar8 == 0) {
            pcVar17 = "The current network is combinational.\n";
            iVar7 = 0;
LAB_00216833:
            Abc_Print(iVar7,pcVar17);
            return 0;
          }
          if (pcVar17 == (char *)0x0) {
            if (bVar2) {
              pVVar13 = pNtk->vBoxes;
              if (0 < pVVar13->nSize) {
                lVar11 = 0;
                do {
                  if ((*(uint *)((long)pVVar13->pArray[lVar11] + 0x14) & 0xf) == 8) {
                    *(undefined8 *)((long)pVVar13->pArray[lVar11] + 0x38) = 1;
                  }
                  lVar11 = lVar11 + 1;
                  pVVar13 = pNtk->vBoxes;
                } while (lVar11 < pVVar13->nSize);
                return 0;
              }
            }
            else if (bVar3) {
              pVVar13 = pNtk->vBoxes;
              if (0 < pVVar13->nSize) {
                lVar11 = 0;
                do {
                  if ((*(uint *)((long)pVVar13->pArray[lVar11] + 0x14) & 0xf) == 8) {
                    *(undefined8 *)((long)pVVar13->pArray[lVar11] + 0x38) = 2;
                  }
                  lVar11 = lVar11 + 1;
                  pVVar13 = pNtk->vBoxes;
                } while (lVar11 < pVVar13->nSize);
                return 0;
              }
            }
            else {
              if (bVar5) {
                tVar12 = time((time_t *)0x0);
                srand((uint)tVar12);
                pVVar13 = pNtk->vBoxes;
                if (pVVar13->nSize < 1) {
                  return 0;
                }
                lVar11 = 0;
                goto LAB_0021690f;
              }
              if (!bVar4) {
                if (bVar6 || local_50 != 0) {
                  if ((bVar6) && (local_50 != 0)) {
                    pcVar17 = "The two options (-c and -n) are incompatible.\n";
                  }
                  else if (pNtk->ntkType == ABC_NTK_STRASH) {
                    if (pAbc->pCex != (Abc_Cex_t *)0x0) {
                      pAig = Abc_NtkToDar(pNtk,0,1);
                      p = Saig_ManReturnFailingState(pAig,pAbc->pCex,local_50);
                      Aig_ManStop(pAig);
                      if (pNtk->vBoxes->nSize < 1) goto LAB_00216a9a;
                      iVar7 = 0;
                      goto LAB_00216a48;
                    }
                    pcVar17 = "The current CEX is not available.\n";
                  }
                  else {
                    pcVar17 = "The current network should be an AIG.\n";
                  }
                }
                else {
                  pcVar17 = "The initial states remain unchanged.\n";
                }
                iVar7 = -1;
                goto LAB_00216833;
              }
              pVVar13 = pNtk->vBoxes;
              if (0 < pVVar13->nSize) {
                lVar11 = 0;
                do {
                  if ((*(uint *)((long)pVVar13->pArray[lVar11] + 0x14) & 0xf) == 8) {
                    *(undefined8 *)((long)pVVar13->pArray[lVar11] + 0x38) = 3;
                  }
                  lVar11 = lVar11 + 1;
                  pVVar13 = pNtk->vBoxes;
                } while (lVar11 < pVVar13->nSize);
                return 0;
              }
            }
          }
          else {
            sVar10 = strlen(pcVar17);
            if (uVar8 != (uint)sVar10) {
              Abc_Print(-1,"The length of init string (%d) differs from the number of flops (%d).\n"
                        ,sVar10,(ulong)uVar8);
              return 1;
            }
            pVVar13 = pNtk->vBoxes;
            if (0 < pVVar13->nSize) {
              lVar11 = 0;
              do {
                if ((*(uint *)((long)pVVar13->pArray[lVar11] + 0x14) & 0xf) == 8) {
                  if (pcVar17[lVar11] == '1') {
                    uVar19 = 2;
                  }
                  else if (pcVar17[lVar11] == '0') {
                    uVar19 = 1;
                  }
                  else {
                    uVar19 = 3;
                  }
                  *(undefined8 *)((long)pVVar13->pArray[lVar11] + 0x38) = uVar19;
                }
                lVar11 = lVar11 + 1;
                pVVar13 = pNtk->vBoxes;
              } while (lVar11 < pVVar13->nSize);
              return 0;
            }
          }
          return 0;
        }
        if (iVar7 == 99) {
          bVar6 = (bool)(bVar6 ^ 1);
        }
        else {
          if (iVar7 != 100) goto LAB_002166f0;
          bVar4 = (bool)(bVar4 ^ 1);
        }
      }
      else if (iVar7 < 0x72) {
        if (iVar7 == 0x6e) {
          local_50 = local_50 ^ 1;
        }
        else {
          if (iVar7 != 0x6f) goto LAB_002166f0;
          bVar3 = (bool)(bVar3 ^ 1);
        }
      }
      else if (iVar7 == 0x72) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else {
        if (iVar7 != 0x7a) goto LAB_002166f0;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a file name.\n");
LAB_002166f0:
      Abc_Print(-2,"usage: init [-zordcnh] [-S <init_string>]\n");
      Abc_Print(-2,"\t         resets initial states of all latches\n");
      pcVar18 = "yes";
      pcVar17 = "yes";
      if (!bVar2) {
        pcVar17 = "no";
      }
      Abc_Print(-2,"\t-z     : set zeros initial states [default = %s]\n",pcVar17);
      pcVar17 = "yes";
      if (!bVar3) {
        pcVar17 = "no";
      }
      Abc_Print(-2,"\t-o     : set ones initial states [default = %s]\n",pcVar17);
      pcVar17 = "yes";
      if (!bVar4) {
        pcVar17 = "no";
      }
      Abc_Print(-2,"\t-d     : set don\'t-care initial states [default = %s]\n",pcVar17);
      pcVar17 = "yes";
      if (!bVar5) {
        pcVar17 = "no";
      }
      Abc_Print(-2,"\t-r     : set random initial states [default = %s]\n",pcVar17);
      pcVar17 = "yes";
      if (!bVar6) {
        pcVar17 = "no";
      }
      Abc_Print(-2,
                "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n"
                ,pcVar17);
      if (local_50 == 0) {
        pcVar18 = "no";
      }
      Abc_Print(-2,
                "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n"
                ,pcVar18);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar17 = "\t-S str : (optional) initial state  [default = unused]\n";
      iVar7 = -2;
LAB_002167fa:
      Abc_Print(iVar7,pcVar17);
      return 1;
    }
    pcVar17 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  } while( true );
LAB_0021690f:
  pvVar1 = pVVar13->pArray[lVar11];
  if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
    uVar8 = rand();
    uVar16 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
    if ((uVar8 & 1) == 0) {
      uVar19 = 1;
      if (uVar16 != 8) goto LAB_00216ade;
    }
    else {
      uVar19 = 2;
      if (uVar16 != 8) goto LAB_00216abf;
    }
    *(undefined8 *)((long)pvVar1 + 0x38) = uVar19;
  }
  lVar11 = lVar11 + 1;
  pVVar13 = pNtk->vBoxes;
  if (pVVar13->nSize <= lVar11) {
    return 0;
  }
  goto LAB_0021690f;
LAB_00216a48:
  pAVar14 = Abc_NtkBox(pNtk,iVar7);
  if ((*(uint *)&pAVar14->field_0x14 & 0xf) == 8) {
    iVar9 = Vec_IntEntry(p,iVar7);
    uVar8 = *(uint *)&pAVar14->field_0x14 & 0xf;
    if (iVar9 == 0) {
      aVar15 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      if (uVar8 != 8) {
LAB_00216ade:
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
    }
    else {
      aVar15 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
      if (uVar8 != 8) {
LAB_00216abf:
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
      }
    }
    pAVar14->field_5 = aVar15;
  }
  iVar7 = iVar7 + 1;
  if (pNtk->vBoxes->nSize <= iVar7) {
LAB_00216a9a:
    Vec_IntFree(p);
    return 0;
  }
  goto LAB_00216a48;
}

Assistant:

int Abc_CommandInit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObj;
    char * pInitStr = NULL;
    int fZeros    = 0;
    int fOnes     = 0;
    int fRandom   = 0;
    int fDontCare = 0;
    int fUseCexCs = 0;
    int fUseCexNs = 0;
    int c, i;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Szordcnh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pInitStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'z':
            fZeros ^= 1;
            break;
        case 'o':
            fOnes ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'd':
            fDontCare ^= 1;
            break;
        case 'c':
            fUseCexCs ^= 1;
            break;
        case 'n':
            fUseCexNs ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The current network is combinational.\n" );
        return 0;
    }

    if ( pInitStr != NULL )
    {
        if ( (int)strlen(pInitStr) != Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "The length of init string (%d) differs from the number of flops (%d).\n", strlen(pInitStr), Abc_NtkLatchNum(pNtk) );
            return 1;
        }
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( pInitStr[i] == '0' )
                Abc_LatchSetInit0( pObj );
            else if ( pInitStr[i] == '1' )
                Abc_LatchSetInit1( pObj );
            else 
                Abc_LatchSetInitDc( pObj );
        return 0;
    }

    if ( fZeros )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit0( pObj );
    }
    else if ( fOnes )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit1( pObj );
    }
    else if ( fRandom )
    {
        srand( time(NULL) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( rand() & 1 )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
    }
    else if ( fDontCare )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInitDc( pObj );
    }
    else if ( fUseCexCs || fUseCexNs )
    {
        extern Vec_Int_t * Saig_ManReturnFailingState( Aig_Man_t * pMan, Abc_Cex_t * p, int fNextOne );
        Aig_Man_t * pMan;
        Vec_Int_t * vFailState;
        if ( fUseCexCs && fUseCexNs )
        {
            Abc_Print( -1, "The two options (-c and -n) are incompatible.\n" );
            return 0;
        }
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "The current network should be an AIG.\n" );
            return 0;
        }
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "The current CEX is not available.\n" );
            return 0;
        }
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
        vFailState = Saig_ManReturnFailingState( pMan, pAbc->pCex, fUseCexNs );
        //Vec_IntPrint( vFailState );
        Aig_ManStop( pMan );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Vec_IntEntry( vFailState, i ) )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
        Vec_IntFree( vFailState );
    }
    else
        Abc_Print( -1, "The initial states remain unchanged.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: init [-zordcnh] [-S <init_string>]\n" );
    Abc_Print( -2, "\t         resets initial states of all latches\n" );
    Abc_Print( -2, "\t-z     : set zeros initial states [default = %s]\n", fZeros? "yes": "no" );
    Abc_Print( -2, "\t-o     : set ones initial states [default = %s]\n", fOnes? "yes": "no" );
    Abc_Print( -2, "\t-d     : set don't-care initial states [default = %s]\n", fDontCare? "yes": "no" );
    Abc_Print( -2, "\t-r     : set random initial states [default = %s]\n", fRandom? "yes": "no" );
    Abc_Print( -2, "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n", fUseCexCs? "yes": "no" );
    Abc_Print( -2, "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n", fUseCexNs? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-S str : (optional) initial state  [default = unused]\n" );
    return 1;
}